

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O2

HeadLossModel * HeadLossModel::factory(string *model,double viscos)

{
  bool bVar1;
  HeadLossModel *this;
  
  bVar1 = std::operator==(model,"H-W");
  if (bVar1) {
    this = (HeadLossModel *)operator_new(0x10);
    HW_HeadLossModel::HW_HeadLossModel((HW_HeadLossModel *)this,viscos);
  }
  else {
    bVar1 = std::operator==(model,"D-W");
    if (bVar1) {
      this = (HeadLossModel *)operator_new(0x10);
      DW_HeadLossModel::DW_HeadLossModel((DW_HeadLossModel *)this,viscos);
    }
    else {
      bVar1 = std::operator==(model,"C-M");
      if (bVar1) {
        this = (HeadLossModel *)operator_new(0x10);
        CM_HeadLossModel::CM_HeadLossModel((CM_HeadLossModel *)this,viscos);
      }
      else {
        this = (HeadLossModel *)0x0;
      }
    }
  }
  return this;
}

Assistant:

HeadLossModel* HeadLossModel::factory(const string model, double viscos)
{
    if ( model == "H-W" ) return new HW_HeadLossModel(viscos);
    if ( model == "D-W" ) return new DW_HeadLossModel(viscos);
    if ( model == "C-M" ) return new CM_HeadLossModel(viscos);
    return nullptr;
}